

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_main.c
# Opt level: O3

int format_align_iter(char *outptr,int maxlen,ps_alignment_iter_t *itor,double utt_start,int frate,
                     logmath_t *lmath)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  float64 fVar4;
  int duration;
  int start;
  int local_38;
  int local_34;
  
  iVar1 = ps_alignment_iter_seg(itor,&local_34,&local_38);
  fVar4 = logmath_exp(lmath,iVar1);
  pcVar2 = ps_alignment_iter_name(itor);
  pcVar3 = "";
  if (pcVar2 != (char *)0x0) {
    pcVar3 = pcVar2;
  }
  iVar1 = snprintf(outptr,(long)maxlen,"{\"b\":%.3f,\"d\":%.3f,\"p\":%.3f,\"t\":\"%s\"",
                   (double)local_34 / (double)frate + utt_start,(double)local_38 / (double)frate,
                   fVar4,pcVar3);
  return iVar1;
}

Assistant:

static int
format_align_iter(char *outptr, int maxlen,
                  ps_alignment_iter_t *itor, double utt_start, int frate, logmath_t *lmath)
{
    int start, duration, score;
    double prob, st, dur;
    const char *word;

    score = ps_alignment_iter_seg(itor, &start, &duration);
    st = utt_start + (double)start / frate;
    dur = (double)duration / frate;
    prob = logmath_exp(lmath, score);
    word = ps_alignment_iter_name(itor);
    if (word == NULL)
        word = "";

    return snprintf(outptr, maxlen, HYP_FORMAT, st, dur, prob, word);
}